

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O2

void __thiscall
gl4cts::ClipControlDepthModeZeroToOneTest::deinit(ClipControlDepthModeZeroToOneTest *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ClipControlApi cc;
  long lVar3;
  
  ClipControlRenderBaseTest::deinit(&this->super_ClipControlRenderBaseTest);
  iVar2 = (*((this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
            m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  bVar1 = ClipControlApi::Supported
                    ((this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.
                     super_TestCase.m_context,
                     (this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.m_api);
  if (bVar1) {
    ClipControlApi::ClipControlApi
              (&cc,(this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
                   m_context,(this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.m_api
              );
    (*cc.clipControl)(0x8ca1,0x935e);
  }
  (**(code **)(lVar3 + 0x1c8))(0);
  (**(code **)(lVar3 + 0x1c0))(0,0,0,0);
  (**(code **)(lVar3 + 0x4e8))(0xb71);
  (**(code **)(lVar3 + 0x4a0))(0x201);
  if (this->m_vao != 0) {
    (**(code **)(lVar3 + 0x490))(1,&this->m_vao);
  }
  if (this->m_vbo != 0) {
    (**(code **)(lVar3 + 0x438))(1,&this->m_vbo);
  }
  return;
}

Assistant:

void deinit()
	{
		ClipControlRenderBaseTest::deinit();

		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		if (ClipControlApi::Supported(m_context, m_api))
		{
			ClipControlApi cc(m_context, m_api);
			cc.clipControl(GL_LOWER_LEFT, GL_NEGATIVE_ONE_TO_ONE);
		}

		gl.clearDepth(0.0);
		gl.clearColor(0.0, 0.0, 0.0, 0.0);

		gl.disable(GL_DEPTH_TEST);
		gl.depthFunc(GL_LESS);

		if (m_vao)
		{
			gl.deleteVertexArrays(1, &m_vao);
		}
		if (m_vbo)
		{
			gl.deleteBuffers(1, &m_vbo);
		}
	}